

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialAnalyzer.cpp
# Opt level: O1

void __thiscall OpenMD::SequentialAnalyzer::doSequence(SequentialAnalyzer *this)

{
  Snapshot *this_00;
  iterator __position;
  int iVar1;
  int whichFrame;
  long lVar2;
  DumpReader reader;
  SelectionSet local_12a0;
  DumpReader local_1288;
  
  (*this->_vptr_SequentialAnalyzer[3])();
  DumpReader::DumpReader(&local_1288,this->info_,&this->dumpFilename_);
  iVar1 = DumpReader::getNFrames(&local_1288);
  this->frame_ = 0;
  if (0 < iVar1) {
    whichFrame = 0;
    do {
      DumpReader::readFrame(&local_1288,whichFrame);
      this_00 = this->info_->sman_->currentSnapshot_;
      this->currentSnapshot_ = this_00;
      local_12a0.bitsets_.
      super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)Snapshot::getTime(this_00);
      __position._M_current =
           (this->times_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->times_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&this->times_,__position,(double *)&local_12a0);
      }
      else {
        *__position._M_current =
             (double)local_12a0.bitsets_.
                     super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                     ._M_impl.super__Vector_impl_data._M_start;
        (this->times_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      if ((this->evaluator1_).isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_12a0,&this->evaluator1_);
        lVar2 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan1_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar2
                     ),(vector<bool,_std::allocator<bool>_> *)
                       ((long)&((local_12a0.bitsets_.
                                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                               super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                       lVar2));
          lVar2 = lVar2 + 0x28;
        } while (lVar2 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_12a0.bitsets_);
      }
      if ((this->evaluator2_).isDynamic_ == true) {
        SelectionEvaluator::evaluate(&local_12a0,&this->evaluator2_);
        lVar2 = 0;
        do {
          std::vector<bool,_std::allocator<bool>_>::operator=
                    ((vector<bool,_std::allocator<bool>_> *)
                     ((long)&(((this->seleMan2_).ss_.bitsets_.
                               super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                               ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                             super__Bvector_base<std::allocator<bool>_>._M_impl.
                             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar2
                     ),(vector<bool,_std::allocator<bool>_> *)
                       ((long)&((local_12a0.bitsets_.
                                 super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                               super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                       lVar2));
          lVar2 = lVar2 + 0x28;
        } while (lVar2 != 0xf0);
        std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
                  (&local_12a0.bitsets_);
      }
      (*this->_vptr_SequentialAnalyzer[6])(this,(ulong)(uint)this->frame_);
      whichFrame = this->frame_ + this->step_;
      this->frame_ = whichFrame;
    } while (whichFrame < iVar1);
  }
  (*this->_vptr_SequentialAnalyzer[4])(this);
  (*this->_vptr_SequentialAnalyzer[5])(this);
  DumpReader::~DumpReader(&local_1288);
  return;
}

Assistant:

void SequentialAnalyzer::doSequence() {
    preSequence();

    DumpReader reader(info_, dumpFilename_);
    int nFrames = reader.getNFrames();

    // storageLayout_ = info_->getStorageLayout();

    for (frame_ = 0; frame_ < nFrames; frame_ += step_) {
      reader.readFrame(frame_);
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();
      times_.push_back(currentSnapshot_->getTime());

      if (evaluator1_.isDynamic()) {
        seleMan1_.setSelectionSet(evaluator1_.evaluate());
      }
      if (evaluator2_.isDynamic()) {
        seleMan2_.setSelectionSet(evaluator2_.evaluate());
      }

      doFrame(frame_);
    }

    postSequence();
    writeSequence();
  }